

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

AssertionItemPortListSyntax * __thiscall
slang::parsing::Parser::parseAssertionItemPortList(Parser *this,SyntaxKind parentKind)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  AssertionItemPortSyntax *pAVar4;
  undefined4 extraout_var;
  AssertionItemPortListSyntax *pAVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind TVar6;
  Token TVar7;
  Token TVar8;
  Token TVar9;
  Token openParen;
  Token closeParen;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  Token local_108;
  Info *local_f8;
  undefined8 local_f0;
  Info *local_e8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_e0;
  ulong local_d0;
  undefined8 uStack_c8;
  undefined8 local_b8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_a8 [2];
  
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (!bVar1) {
    return (AssertionItemPortListSyntax *)0x0;
  }
  TVar7 = ParserBase::consume(&this->super_ParserBase);
  local_e8 = TVar7.info;
  uVar3 = TVar7._0_8_;
  local_a8[0].data_ = (pointer)local_a8[0].firstElement;
  local_a8[0].len = 0;
  local_a8[0].cap = 4;
  Token::Token(&local_108);
  TVar7 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar7.kind);
  if (bVar1) {
    local_108 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossiblePropertyPortItem(TVar7.kind);
    if (!bVar1) {
      ParserBase::reportMissingList
                (&this->super_ParserBase,TVar7,CloseParenthesis,&local_108,(DiagCode)0x2e0005);
      src = extraout_RDX_03;
      goto LAB_00442788;
    }
    do {
      local_f0 = uVar3;
      local_f8 = TVar7.info;
      uVar3 = TVar7._0_8_;
      pAVar4 = parseAssertionItemPort(this,parentKind);
      local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pAVar4;
      local_d0 = CONCAT71(local_d0._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                (local_a8,(TokenOrSyntax *)&local_e0._M_first);
      TVar8 = ParserBase::peek(&this->super_ParserBase);
      TVar6 = TVar8.kind;
      bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
      TVar8.info = local_f8;
      TVar8.kind = (short)uVar3;
      TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
      TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
      TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
      iVar2 = 3;
      src = extraout_RDX;
      if (TVar6 != EndOfFile && !bVar1) {
        if (TVar6 != Comma) {
          ParserBase::expect(&this->super_ParserBase,Comma);
          do {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePropertyPortItem,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x2e0005,false);
            if (!bVar1) {
              local_108 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              TVar8.info = local_f8;
              TVar8.kind = (short)uVar3;
              TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
              TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
              TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
              src = local_108.info;
              iVar2 = 1;
              goto LAB_00442741;
            }
            bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
          } while (!bVar1);
        }
        local_e0._M_first._M_storage =
             (_Uninitialized<slang::parsing::Token,_true>)
             ParserBase::expect(&this->super_ParserBase,Comma);
        local_d0 = local_d0 & 0xffffffffffffff00;
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  (local_a8,(TokenOrSyntax *)&local_e0._M_first);
        TVar9 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar9.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        if (TVar6 == EndOfFile || bVar1) {
          ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
          TVar8.info = local_f8;
          TVar8.kind = (short)uVar3;
          TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
          TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
          TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
          src = extraout_RDX_01;
        }
        else {
          src = extraout_RDX_00;
          if (local_f8 == TVar9.info && TVar7.kind == TVar6) {
            bVar1 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossiblePropertyPortItem,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x2e0005,true);
            TVar8.info = local_f8;
            TVar8.kind = (short)uVar3;
            TVar8._2_1_ = (char)((ulong)uVar3 >> 0x10);
            TVar8.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
            TVar8.rawLen = (int)((ulong)uVar3 >> 0x20);
            src = extraout_RDX_02;
            if (!bVar1) goto LAB_00442741;
          }
          iVar2 = 0;
          TVar8 = TVar9;
        }
      }
LAB_00442741:
      TVar7 = TVar8;
      uVar3 = local_f0;
      local_f8 = TVar7.info;
    } while (iVar2 == 0);
    if (iVar2 != 3) goto LAB_00442788;
    local_108 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  }
  src = local_108.info;
LAB_00442788:
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (local_a8,(EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_b8 = CONCAT44(extraout_var,iVar2);
  local_e0._8_4_ = 3;
  local_d0 = 0;
  uStack_c8 = 0;
  local_e0._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a4fb0;
  openParen.info = local_e8;
  openParen.kind = (short)uVar3;
  openParen._2_1_ = (char)((ulong)uVar3 >> 0x10);
  openParen.numFlags.raw = (char)((ulong)uVar3 >> 0x18);
  openParen.rawLen = (int)((ulong)uVar3 >> 0x20);
  pAVar5 = slang::syntax::SyntaxFactory::assertionItemPortList
                     (&this->factory,openParen,
                      (SeparatedSyntaxList<slang::syntax::AssertionItemPortSyntax> *)
                      &local_e0._M_first,local_108);
  if (local_a8[0].data_ != (pointer)local_a8[0].firstElement) {
    operator_delete(local_a8[0].data_);
  }
  return pAVar5;
}

Assistant:

AssertionItemPortListSyntax* Parser::parseAssertionItemPortList(SyntaxKind parentKind) {
    if (!peek(TokenKind::OpenParenthesis))
        return nullptr;

    auto openParen = consume();

    SmallVector<TokenOrSyntax, 4> buffer;
    Token closeParen;
    parseList<isPossiblePropertyPortItem, isEndOfParenList>(
        buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen, RequireItems::False,
        diag::ExpectedAssertionItemPort,
        [this, parentKind] { return &parseAssertionItemPort(parentKind); });

    return &factory.assertionItemPortList(openParen, buffer.copy(alloc), closeParen);
}